

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setRandomUniforms
          (Program *this,vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *uniforms,
          string *shaderNameManglingSuffix,Random *rnd)

{
  pointer source;
  float fVar1;
  float fVar2;
  GLuint program;
  DataType DVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GLint location;
  deUint32 dVar7;
  pointer pVVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float val [4];
  undefined1 local_98 [8];
  GLfloat local_90;
  GLfloat local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [3];
  pointer local_58;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *local_50;
  Program *local_48;
  string *local_40;
  long local_38;
  
  local_48 = this;
  local_40 = shaderNameManglingSuffix;
  glwUseProgram(this->m_programGL);
  pVVar8 = (uniforms->super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(uniforms->
                              super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8) >> 3) *
          0x3cf3cf3d) {
    lVar9 = 100;
    local_38 = 0;
    local_50 = uniforms;
    do {
      source = pVVar8 + local_38;
      uVar6 = glu::getDataTypeScalarSize(pVVar8[local_38].type);
      program = local_48->m_programGL;
      local_58 = source;
      mangleShaderNames((string *)local_98,&source->name,local_40);
      location = glwGetUniformLocation(program,(GLchar *)CONCAT44(local_98._4_4_,local_98._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_98._4_4_,local_98._0_4_) != local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_98._4_4_,local_98._0_4_),
                        local_88[0]._M_allocated_capacity + 1);
      }
      if (-1 < location) {
        DVar3 = local_58->type;
        if (DVar3 - TYPE_FLOAT < 4) {
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              fVar1 = *(float *)((long)pVVar8 + uVar10 * 4 + lVar9 + -0x40);
              fVar2 = *(float *)((long)&(pVVar8->name)._M_dataplus._M_p + uVar10 * 4 + lVar9);
              fVar11 = deRandom_getFloat(&rnd->m_rnd);
              *(float *)(local_98 + uVar10 * 4) = fVar11 * (fVar2 - fVar1) + fVar1;
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          switch(local_58->type) {
          case TYPE_FLOAT:
            glwUniform1f(location,(GLfloat)local_98._0_4_);
            break;
          case TYPE_FLOAT_VEC2:
            glwUniform2f(location,(GLfloat)local_98._0_4_,(GLfloat)local_98._4_4_);
            break;
          case TYPE_FLOAT_VEC3:
            glwUniform3f(location,(GLfloat)local_98._0_4_,(GLfloat)local_98._4_4_,local_90);
            break;
          case TYPE_FLOAT_VEC4:
            glwUniform4f(location,(GLfloat)local_98._0_4_,(GLfloat)local_98._4_4_,local_90,local_8c)
            ;
          }
        }
        else if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              fVar1 = *(float *)((long)pVVar8 + uVar10 * 4 + lVar9 + -0x40);
              fVar2 = *(float *)((long)&(pVVar8->name)._M_dataplus._M_p + uVar10 * 4 + lVar9);
              fVar11 = deRandom_getFloat(&rnd->m_rnd);
              *(float *)(local_98 + uVar10 * 4) = fVar11 * (fVar2 - fVar1) + fVar1;
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          switch(local_58->type) {
          case TYPE_FLOAT_MAT2:
            glwUniformMatrix2fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT2X3:
            glwUniformMatrix2x3fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT2X4:
            glwUniformMatrix2x4fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT3X2:
            glwUniformMatrix3x2fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT3:
            glwUniformMatrix3fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT3X4:
            glwUniformMatrix3x4fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT4X2:
            glwUniformMatrix4x2fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT4X3:
            glwUniformMatrix4x3fv(location,1,'\0',(GLfloat *)local_98);
            break;
          case TYPE_FLOAT_MAT4:
            glwUniformMatrix4fv(location,1,'\0',(GLfloat *)local_98);
          }
        }
        else if (DVar3 - TYPE_INT < 4) {
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              iVar4 = *(int *)((long)pVVar8 + uVar10 * 4 + lVar9 + -0x40);
              iVar5 = *(int *)((long)&(pVVar8->name)._M_dataplus._M_p + uVar10 * 4 + lVar9);
              dVar7 = deRandom_getUint32(&rnd->m_rnd);
              *(uint *)(local_98 + uVar10 * 4) = dVar7 % ((iVar5 - iVar4) + 1U) + iVar4;
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          switch(local_58->type) {
          case TYPE_INT:
            glwUniform1i(location,local_98._0_4_);
            break;
          case TYPE_INT_VEC2:
            glwUniform2i(location,local_98._0_4_,local_98._4_4_);
            break;
          case TYPE_INT_VEC3:
            glwUniform3i(location,local_98._0_4_,local_98._4_4_,(GLint)local_90);
            break;
          case TYPE_INT_VEC4:
            glwUniform4i(location,local_98._0_4_,local_98._4_4_,(GLint)local_90,(GLint)local_8c);
          }
        }
        else if (DVar3 - TYPE_UINT < 4) {
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              iVar4 = *(int *)((long)pVVar8 + uVar10 * 4 + lVar9 + -0x40);
              iVar5 = *(int *)((long)&(pVVar8->name)._M_dataplus._M_p + uVar10 * 4 + lVar9);
              dVar7 = deRandom_getUint32(&rnd->m_rnd);
              *(uint *)(local_98 + uVar10 * 4) = dVar7 % ((iVar5 - iVar4) + 1U) + iVar4;
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          switch(local_58->type) {
          case TYPE_UINT:
            glwUniform1ui(location,local_98._0_4_);
            break;
          case TYPE_UINT_VEC2:
            glwUniform2ui(location,local_98._0_4_,local_98._4_4_);
            break;
          case TYPE_UINT_VEC3:
            glwUniform3ui(location,local_98._0_4_,local_98._4_4_,(GLuint)local_90);
            break;
          case TYPE_UINT_VEC4:
            glwUniform4ui(location,local_98._0_4_,local_98._4_4_,(GLuint)local_90,(GLuint)local_8c);
          }
        }
      }
      local_38 = local_38 + 1;
      pVVar8 = (local_50->
               super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0xa8;
    } while (local_38 <
             (int)((ulong)((long)(local_50->
                                 super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8) >> 3) *
             0x3cf3cf3d);
  }
  return;
}

Assistant:

void Program::setRandomUniforms (const vector<VarSpec>& uniforms, const string& shaderNameManglingSuffix, Random& rnd) const
{
	use();

	for (int unifNdx = 0; unifNdx < (int)uniforms.size(); unifNdx++)
	{
		const VarSpec&	spec			= uniforms[unifNdx];
		const int		typeScalarSize	= glu::getDataTypeScalarSize(spec.type);
		const int		location		= glGetUniformLocation(m_programGL, mangleShaderNames(spec.name, shaderNameManglingSuffix).c_str());
		if (location < 0)
			continue;

		if (glu::isDataTypeFloatOrVec(spec.type))
		{
			float val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT:		glUniform1f(location, val[0]);							break;
				case glu::TYPE_FLOAT_VEC2:	glUniform2f(location, val[0], val[1]);					break;
				case glu::TYPE_FLOAT_VEC3:	glUniform3f(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_FLOAT_VEC4:	glUniform4f(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeMatrix(spec.type))
		{
			float val[4*4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT_MAT2:		glUniformMatrix2fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3:		glUniformMatrix3fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4:		glUniformMatrix4fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X3:	glUniformMatrix2x3fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X4:	glUniformMatrix2x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X2:	glUniformMatrix3x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X4:	glUniformMatrix3x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X2:	glUniformMatrix4x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X3:	glUniformMatrix4x3fv	(location, 1, GL_FALSE, &val[0]); break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(spec.type))
		{
			int val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);

			switch (spec.type)
			{
				case glu::TYPE_INT:			glUniform1i(location, val[0]);							break;
				case glu::TYPE_INT_VEC2:	glUniform2i(location, val[0], val[1]);					break;
				case glu::TYPE_INT_VEC3:	glUniform3i(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_INT_VEC4:	glUniform4i(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeUintOrUVec(spec.type))
		{
			deUint32 val[4];
			for (int i = 0; i < typeScalarSize; i++)
			{
				DE_ASSERT(spec.minValue.i[i] >= 0 && spec.maxValue.i[i] >= 0);
				val[i] = (deUint32)rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);
			}

			switch (spec.type)
			{
				case glu::TYPE_UINT:		glUniform1ui(location, val[0]);							break;
				case glu::TYPE_UINT_VEC2:	glUniform2ui(location, val[0], val[1]);					break;
				case glu::TYPE_UINT_VEC3:	glUniform3ui(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_UINT_VEC4:	glUniform4ui(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else
			DE_ASSERT(false);
	}
}